

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

DynamicTypeHandler * __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
ConvertToTypeWithItemAttributes
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance)

{
  int *piVar1;
  bool bVar2;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar3;
  
  bVar2 = JavascriptArray::IsNonES5Array(instance);
  if (bVar2) {
    pEVar3 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
             ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>,Js::PropertyRecord_const*>
                       ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>
                         *)this,instance);
  }
  else {
    pEVar3 = (ES5ArrayTypeHandlerBase<unsigned_short> *)
             SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
             ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>,Js::PropertyRecord_const*>
                       ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>
                         *)this,instance);
  }
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->
            convertSimpleDictionaryToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  return (DynamicTypeHandler *)pEVar3;
}

Assistant:

DynamicTypeHandler* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeWithItemAttributes(DynamicObject* instance)
    {
        return JavascriptArray::IsNonES5Array(instance) ?
            ConvertToES5ArrayType(instance) : ConvertToDictionaryType(instance);
    }